

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-common.cpp
# Opt level: O1

void test_common<double>(uint length,double value)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _func_int **pp_Var2;
  bool bVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  undefined8 uVar19;
  undefined4 uVar20;
  undefined8 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var26;
  __shared_count<(__gnu_cxx::_Lock_policy)2> __s;
  double dVar27;
  uint i;
  int iVar28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var29;
  ulong uVar30;
  undefined8 *puVar31;
  uint uVar32;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var33;
  uint uVar34;
  size_t __size;
  uint uVar35;
  uint uVar36;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 uVar37;
  _Atomic_word _Var38;
  _Atomic_word _Var39;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var40;
  ulong uVar41;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  shared_ptr<double> pa;
  shared_ptr<double> pb;
  undefined1 local_58 [16];
  
  local_58._8_4_ = in_XMM0_Dc;
  local_58._0_8_ = value;
  local_58._12_4_ = in_XMM0_Dd;
  __size = (long)(int)(length + 1) << 3;
  iVar28 = posix_memalign(&pa.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi,0x40,__size);
  local_98 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (iVar28 == 0) {
    local_98 = pa.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<double*,void(*)(double*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pa,local_98,sse::common::free<double>);
  iVar28 = posix_memalign(&local_a0,0x40,__size);
  pa.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (iVar28 == 0) {
    pa.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_a0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<double*,void(*)(double*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pb,
             pa.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             sse::common::free<double>);
  __s._M_pi = pa.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  p_Var26 = local_98;
  uVar18 = (ulong)length;
  (&local_98->_vptr__Sp_counted_base)[uVar18] = (_func_int **)0x405fc00000000000;
  (&(pa.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _vptr__Sp_counted_base)[uVar18] = (_func_int **)0x404f800000000000;
  uVar37 = SUB84(value,0);
  _Var38 = (_Atomic_word)((ulong)value >> 0x20);
  p_Var29 = local_98;
  uVar32 = length;
  uVar34 = length;
  if (7 < (int)length) {
    do {
      _Var4._M_use_count = uVar37;
      _Var4._vptr__Sp_counted_base = (_func_int **)value;
      _Var4._M_weak_count = _Var38;
      *p_Var29 = _Var4;
      _Var5._M_use_count = uVar37;
      _Var5._vptr__Sp_counted_base = (_func_int **)value;
      _Var5._M_weak_count = _Var38;
      p_Var29[1] = _Var5;
      _Var6._M_use_count = uVar37;
      _Var6._vptr__Sp_counted_base = (_func_int **)value;
      _Var6._M_weak_count = _Var38;
      p_Var29[2] = _Var6;
      _Var7._M_use_count = uVar37;
      _Var7._vptr__Sp_counted_base = (_func_int **)value;
      _Var7._M_weak_count = _Var38;
      p_Var29[3] = _Var7;
      uVar32 = uVar34 - 8;
      p_Var29 = p_Var29 + 4;
      bVar3 = 0xf < (int)uVar34;
      uVar34 = uVar32;
    } while (bVar3);
  }
  if (3 < (int)uVar32) {
    _Var8._M_use_count = uVar37;
    _Var8._vptr__Sp_counted_base = (_func_int **)value;
    _Var8._M_weak_count = _Var38;
    *p_Var29 = _Var8;
    _Var9._M_use_count = uVar37;
    _Var9._vptr__Sp_counted_base = (_func_int **)value;
    _Var9._M_weak_count = _Var38;
    p_Var29[1] = _Var9;
    uVar32 = uVar32 - 4;
    p_Var29 = p_Var29 + 2;
  }
  if (1 < (int)uVar32) {
    _Var10._M_use_count = uVar37;
    _Var10._vptr__Sp_counted_base = (_func_int **)value;
    _Var10._M_weak_count = _Var38;
    *p_Var29 = _Var10;
    uVar32 = uVar32 - 2;
    p_Var29 = p_Var29 + 1;
  }
  if (uVar32 != 0) {
    p_Var29->_vptr__Sp_counted_base = (_func_int **)value;
  }
  if (length != 0) {
    uVar30 = 0;
    do {
      if (((double)(&local_98->_vptr__Sp_counted_base)[uVar30] != value) ||
         (NAN((double)(&local_98->_vptr__Sp_counted_base)[uVar30]) || NAN(value))) {
        puVar31 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar31 = "void test_common(unsigned int, T) [T = double]";
        *(undefined4 *)(puVar31 + 1) = 0x16;
        *(uint *)((long)puVar31 + 0xc) = length;
        __cxa_throw(puVar31,&Exception::typeinfo,0);
      }
      uVar30 = uVar30 + 1;
    } while (uVar18 != uVar30);
  }
  p_Var29 = local_98;
  _Var33._M_pi = pa.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  uVar32 = length;
  uVar34 = length;
  dVar27 = value;
  if (3 < (int)length) {
    do {
      uVar32 = p_Var29->_M_use_count;
      uVar11 = p_Var29->_M_weak_count;
      uVar14 = *(uint *)&p_Var29[1]._vptr__Sp_counted_base;
      uVar15 = *(uint *)((long)&p_Var29[1]._vptr__Sp_counted_base + 4);
      pp_Var2 = p_Var29[2]._vptr__Sp_counted_base;
      uVar35 = *(uint *)&p_Var29->_vptr__Sp_counted_base;
      uVar36 = *(uint *)((long)&p_Var29->_vptr__Sp_counted_base + 4);
      if (sse::internals::abs_pd(double(int))::sign_mask == '\0') {
        local_58._0_8_ = pp_Var2;
        pb.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var29->_vptr__Sp_counted_base;
        test_common<double>();
        uVar35 = (uint)pb.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        uVar36 = pb.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_;
        value = (double)pp_Var2;
      }
      uVar25 = sse::internals::abs_pd(double(int))::sign_mask._12_4_;
      uVar24 = sse::internals::abs_pd(double(int))::sign_mask._8_4_;
      uVar23 = sse::internals::abs_pd(double(int))::sign_mask._4_4_;
      uVar37 = sse::internals::abs_pd(double(int))::sign_mask._0_4_;
      pp_Var2 = p_Var29[2]._vptr__Sp_counted_base;
      if (sse::internals::abs_pd(double(int))::sign_mask == '\0') {
        pb.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = uVar36;
        pb.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = uVar35;
        test_common<double>();
        uVar35 = (uint)pb.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        uVar36 = pb.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_;
        value = (double)local_58._0_8_;
        pp_Var2 = (_func_int **)local_58._0_8_;
      }
      uVar16 = ~sse::internals::abs_pd(double(int))::sign_mask._0_4_;
      uVar17 = ~sse::internals::abs_pd(double(int))::sign_mask._4_4_;
      uVar12 = ~sse::internals::abs_pd(double(int))::sign_mask._8_4_;
      uVar13 = ~sse::internals::abs_pd(double(int))::sign_mask._12_4_;
      *(uint *)&(_Var33._M_pi)->_vptr__Sp_counted_base = ~uVar37 & uVar35;
      *(uint *)((long)&(_Var33._M_pi)->_vptr__Sp_counted_base + 4) = ~uVar23 & uVar36;
      (_Var33._M_pi)->_M_use_count = ~uVar24 & uVar32;
      (_Var33._M_pi)->_M_weak_count = ~uVar25 & uVar11;
      *(uint *)&_Var33._M_pi[1]._vptr__Sp_counted_base = uVar16 & uVar14;
      *(uint *)((long)&_Var33._M_pi[1]._vptr__Sp_counted_base + 4) = uVar17 & uVar15;
      _Var33._M_pi[1]._M_use_count = uVar12 & (uint)pp_Var2;
      _Var33._M_pi[1]._M_weak_count = uVar13 & (uint)((ulong)pp_Var2 >> 0x20);
      uVar32 = uVar34 - 4;
      p_Var29 = p_Var29 + 2;
      _Var33._M_pi = _Var33._M_pi + 2;
      bVar3 = 7 < (int)uVar34;
      uVar34 = uVar32;
      dVar27 = (double)local_58._0_8_;
    } while (bVar3);
  }
  local_58._0_8_ = dVar27;
  if (1 < (int)uVar32) {
    uVar34 = *(uint *)&p_Var29->_vptr__Sp_counted_base;
    uVar11 = *(uint *)((long)&p_Var29->_vptr__Sp_counted_base + 4);
    uVar30._0_4_ = p_Var29->_M_use_count;
    uVar30._4_4_ = p_Var29->_M_weak_count;
    if (sse::internals::abs_pd(double(int))::sign_mask == '\0') {
      test_common<double>();
      value = (double)local_58._0_8_;
    }
    uVar14 = ~sse::internals::abs_pd(double(int))::sign_mask._4_4_;
    uVar30 = ~CONCAT44(sse::internals::abs_pd(double(int))::sign_mask._12_4_,
                       sse::internals::abs_pd(double(int))::sign_mask._8_4_) & uVar30;
    *(uint *)&(_Var33._M_pi)->_vptr__Sp_counted_base =
         ~sse::internals::abs_pd(double(int))::sign_mask._0_4_ & uVar34;
    *(uint *)((long)&(_Var33._M_pi)->_vptr__Sp_counted_base + 4) = uVar14 & uVar11;
    (_Var33._M_pi)->_M_use_count = (_Atomic_word)uVar30;
    (_Var33._M_pi)->_M_weak_count = (_Atomic_word)(uVar30 >> 0x20);
    uVar32 = uVar32 - 2;
    p_Var29 = p_Var29 + 1;
    _Var33._M_pi = _Var33._M_pi + 1;
  }
  if (uVar32 != 0) {
    pp_Var2 = p_Var29->_vptr__Sp_counted_base;
    if (sse::internals::abs_pd(double(int))::sign_mask == '\0') {
      test_common<double>();
      value = (double)local_58._0_8_;
    }
    (_Var33._M_pi)->_vptr__Sp_counted_base =
         (_func_int **)
         (~CONCAT44(sse::internals::abs_pd(double(int))::sign_mask._4_4_,
                    sse::internals::abs_pd(double(int))::sign_mask._0_4_) & (ulong)pp_Var2);
  }
  if (length != 0) {
    uVar30 = 0;
    do {
      if (((double)(&(__s._M_pi)->_vptr__Sp_counted_base)[uVar30] != value) ||
         (NAN((double)(&(__s._M_pi)->_vptr__Sp_counted_base)[uVar30]) || NAN(value))) {
        puVar31 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar31 = "void test_common(unsigned int, T) [T = double]";
        *(undefined4 *)(puVar31 + 1) = 0x1d;
        *(uint *)((long)puVar31 + 0xc) = length;
        __cxa_throw(puVar31,&Exception::typeinfo,0);
      }
      uVar30 = uVar30 + 1;
    } while (uVar18 != uVar30);
  }
  _Var33._M_pi = __s._M_pi;
  uVar32 = length;
  if (7 < (int)length) {
    uVar32 = 0xf;
    if ((int)length < 0xf) {
      uVar32 = length;
    }
    uVar32 = (length - uVar32) + 7;
    uVar30 = (ulong)(uVar32 >> 3);
    memset(__s._M_pi,0,uVar30 * 0x40 + 0x40);
    uVar32 = (length - (uVar32 & 0xfffffff8)) - 8;
    _Var33._M_pi = __s._M_pi + uVar30 * 4 + 4;
  }
  if (3 < (int)uVar32) {
    uVar32 = uVar32 - 4;
    _Var33._M_pi[1]._vptr__Sp_counted_base = (_func_int **)0x0;
    _Var33._M_pi[1]._M_use_count = 0;
    _Var33._M_pi[1]._M_weak_count = 0;
    (_Var33._M_pi)->_vptr__Sp_counted_base = (_func_int **)0x0;
    (_Var33._M_pi)->_M_use_count = 0;
    (_Var33._M_pi)->_M_weak_count = 0;
    _Var33._M_pi = _Var33._M_pi + 2;
  }
  if (1 < (int)uVar32) {
    (_Var33._M_pi)->_vptr__Sp_counted_base = (_func_int **)0x0;
    (_Var33._M_pi)->_M_use_count = 0;
    (_Var33._M_pi)->_M_weak_count = 0;
    uVar32 = uVar32 - 2;
    _Var33._M_pi = _Var33._M_pi + 1;
  }
  if (uVar32 != 0) {
    (_Var33._M_pi)->_vptr__Sp_counted_base = (_func_int **)0x0;
  }
  if (length != 0) {
    uVar30 = 0;
    do {
      if (((double)(&(__s._M_pi)->_vptr__Sp_counted_base)[uVar30] != 0.0) ||
         (NAN((double)(&(__s._M_pi)->_vptr__Sp_counted_base)[uVar30]))) {
        puVar31 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar31 = "void test_common(unsigned int, T) [T = double]";
        *(undefined4 *)(puVar31 + 1) = 0x24;
        *(uint *)((long)puVar31 + 0xc) = length;
        __cxa_throw(puVar31,&Exception::typeinfo,0);
      }
      uVar30 = uVar30 + 1;
    } while (uVar18 != uVar30);
    uVar30 = 0;
    do {
      (&p_Var26->_vptr__Sp_counted_base)[uVar30] = (_func_int **)(double)(uVar30 & 0xffffffff);
      uVar30 = uVar30 + 1;
    } while (uVar18 != uVar30);
  }
  p_Var29 = p_Var26;
  _Var33._M_pi = __s._M_pi;
  uVar32 = length;
  uVar34 = length;
  if (3 < (int)length) {
    do {
      pp_Var2 = p_Var29->_vptr__Sp_counted_base;
      uVar41._0_4_ = p_Var29->_M_use_count;
      uVar41._4_4_ = p_Var29->_M_weak_count;
      p_Var1 = p_Var29 + 1;
      local_58._0_4_ = *(undefined4 *)&p_Var1->_vptr__Sp_counted_base;
      local_58._4_4_ = *(uint *)((long)&p_Var29[1]._vptr__Sp_counted_base + 4);
      uVar19 = p_Var1->_vptr__Sp_counted_base;
      uVar20 = p_Var1->_M_use_count;
      _Var38 = p_Var29[1]._M_weak_count;
      _Var39 = p_Var29[1]._M_use_count;
      if (sse::internals::abs_pd(double(int))::sign_mask == '\0') {
        test_common<double>();
        local_58._0_4_ = (undefined4)uVar19;
        local_58._4_4_ = (undefined4)((ulong)uVar19 >> 0x20);
        _Var39 = uVar20;
      }
      uVar30 = CONCAT44(sse::internals::abs_pd(double(int))::sign_mask._12_4_,
                        sse::internals::abs_pd(double(int))::sign_mask._8_4_);
      _Var40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     CONCAT44(sse::internals::abs_pd(double(int))::sign_mask._4_4_,
                              sse::internals::abs_pd(double(int))::sign_mask._0_4_);
      if (sse::internals::abs_pd(double(int))::sign_mask == '\0') {
        pb.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             CONCAT44(sse::internals::abs_pd(double(int))::sign_mask._4_4_,
                      sse::internals::abs_pd(double(int))::sign_mask._0_4_);
        test_common<double>();
        _Var40._M_pi = pb.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      }
      uVar41 = ~uVar30 & uVar41;
      uVar32 = ~sse::internals::abs_pd(double(int))::sign_mask._0_4_;
      uVar11 = ~sse::internals::abs_pd(double(int))::sign_mask._4_4_;
      uVar30 = ~CONCAT44(sse::internals::abs_pd(double(int))::sign_mask._12_4_,
                         sse::internals::abs_pd(double(int))::sign_mask._8_4_) &
               CONCAT44(_Var38,_Var39);
      (_Var33._M_pi)->_vptr__Sp_counted_base = (_func_int **)(~(ulong)_Var40._M_pi & (ulong)pp_Var2)
      ;
      (_Var33._M_pi)->_M_use_count = (int)uVar41;
      (_Var33._M_pi)->_M_weak_count = (int)(uVar41 >> 0x20);
      *(uint *)&_Var33._M_pi[1]._vptr__Sp_counted_base = uVar32 & local_58._0_4_;
      *(uint *)((long)&_Var33._M_pi[1]._vptr__Sp_counted_base + 4) = uVar11 & local_58._4_4_;
      _Var33._M_pi[1]._M_use_count = (_Atomic_word)uVar30;
      _Var33._M_pi[1]._M_weak_count = (_Atomic_word)(uVar30 >> 0x20);
      uVar32 = uVar34 - 4;
      p_Var29 = p_Var29 + 2;
      _Var33._M_pi = _Var33._M_pi + 2;
      bVar3 = 7 < (int)uVar34;
      uVar34 = uVar32;
    } while (bVar3);
  }
  if (1 < (int)uVar32) {
    local_58._0_4_ = *(undefined4 *)&p_Var29->_vptr__Sp_counted_base;
    local_58._4_4_ = *(uint *)((long)&p_Var29->_vptr__Sp_counted_base + 4);
    uVar21 = p_Var29->_vptr__Sp_counted_base;
    uVar22 = p_Var29->_M_use_count;
    _Var38 = p_Var29->_M_weak_count;
    _Var39 = p_Var29->_M_use_count;
    if (sse::internals::abs_pd(double(int))::sign_mask == '\0') {
      test_common<double>();
      local_58._0_4_ = (undefined4)uVar21;
      local_58._4_4_ = (undefined4)((ulong)uVar21 >> 0x20);
      _Var39 = uVar22;
    }
    uVar34 = ~sse::internals::abs_pd(double(int))::sign_mask._4_4_;
    uVar30 = ~CONCAT44(sse::internals::abs_pd(double(int))::sign_mask._12_4_,
                       sse::internals::abs_pd(double(int))::sign_mask._8_4_) &
             CONCAT44(_Var38,_Var39);
    *(undefined4 *)&(_Var33._M_pi)->_vptr__Sp_counted_base =
         ~sse::internals::abs_pd(double(int))::sign_mask._0_4_ & local_58._0_4_;
    *(uint *)((long)&(_Var33._M_pi)->_vptr__Sp_counted_base + 4) = uVar34 & local_58._4_4_;
    (_Var33._M_pi)->_M_use_count = (_Atomic_word)uVar30;
    (_Var33._M_pi)->_M_weak_count = (_Atomic_word)(uVar30 >> 0x20);
    uVar32 = uVar32 - 2;
    p_Var29 = p_Var29 + 1;
    _Var33._M_pi = _Var33._M_pi + 1;
  }
  if (uVar32 != 0) {
    pp_Var2 = p_Var29->_vptr__Sp_counted_base;
    if (sse::internals::abs_pd(double(int))::sign_mask == '\0') {
      test_common<double>();
    }
    (_Var33._M_pi)->_vptr__Sp_counted_base =
         (_func_int **)
         (~CONCAT44(sse::internals::abs_pd(double(int))::sign_mask._4_4_,
                    sse::internals::abs_pd(double(int))::sign_mask._0_4_) & (ulong)pp_Var2);
  }
  if (length != 0) {
    uVar30 = 0;
    do {
      if (((double)(&(__s._M_pi)->_vptr__Sp_counted_base)[uVar30] != (double)(uVar30 & 0xffffffff))
         || (NAN((double)(&(__s._M_pi)->_vptr__Sp_counted_base)[uVar30]) ||
             NAN((double)(uVar30 & 0xffffffff)))) {
        puVar31 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar31 = "void test_common(unsigned int, T) [T = double]";
        *(undefined4 *)(puVar31 + 1) = 0x2d;
        *(uint *)((long)puVar31 + 0xc) = length;
        __cxa_throw(puVar31,&Exception::typeinfo,0);
      }
      uVar30 = uVar30 + 1;
    } while (uVar18 != uVar30);
  }
  if (((((double)(&p_Var26->_vptr__Sp_counted_base)[uVar18] == 127.0) &&
       (!NAN((double)(&p_Var26->_vptr__Sp_counted_base)[uVar18]))) &&
      ((double)(&(__s._M_pi)->_vptr__Sp_counted_base)[uVar18] == 63.0)) &&
     (!NAN((double)(&(__s._M_pi)->_vptr__Sp_counted_base)[uVar18]))) {
    if (pb.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pb.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    if (pa.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pa.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    return;
  }
  puVar31 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar31 = "void test_common(unsigned int, T) [T = double]";
  *(undefined4 *)(puVar31 + 1) = 0x31;
  *(uint *)((long)puVar31 + 0xc) = length;
  __cxa_throw(puVar31,&Exception::typeinfo,0);
}

Assistant:

void test_common(unsigned length, T value = 42)
{
    std::shared_ptr<T> pa = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    std::shared_ptr<T> pb = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * a = pa.get();
    T * b = pb.get();
    a[length] = 0x7f;
    b[length] = 0x3f;

    simd::set(value, a, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (a[i] != value)
            FAIL();
    }

    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != value)
            FAIL();
    }

    simd::zero(b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != 0)
            FAIL();
    }

    for (unsigned i=0; i<length; ++i)
        a[i] = i;
    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != (T)i)
            FAIL();
    }

    if (a[length] != 0x7f || b[length] != 0x3f)
        FAIL();
}